

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

int pnga_register_type(size_t bytes)

{
  bool bVar1;
  int i;
  size_t bytes_local;
  int local_4;
  
  i = 0x11;
  while( true ) {
    bVar1 = false;
    if (i < 0x100) {
      bVar1 = ga_types[i].active == 1;
    }
    if (!bVar1) break;
    i = i + 1;
  }
  if (i == 0x100) {
    local_4 = -1;
  }
  else {
    ga_types[i].active = 1;
    ga_types[i].size = bytes;
    local_4 = i + 1000;
  }
  return local_4;
}

Assistant:

int pnga_register_type(size_t bytes) {
  int i;
  for(i=GA_TYPES_RESERVED; i<GA_TYPES_MAX && ga_types[i].active==1; i++);
  if(i==GA_TYPES_MAX) {
    return -1;
  }
  ga_types[i].active = 1;
  ga_types[i].size = bytes;
  return i+MT_BASE;
}